

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void llvm::APInt::tcFullMultiply
               (WordType *dst,WordType *lhs,WordType *rhs,uint lhsParts,uint rhsParts)

{
  uint srcParts;
  WordType *pWVar1;
  long lVar2;
  
  do {
    srcParts = rhsParts;
    rhsParts = lhsParts;
    pWVar1 = lhs;
    lhs = rhs;
    rhs = pWVar1;
    lhsParts = srcParts;
  } while (srcParts < rhsParts);
  if ((pWVar1 != dst) && (lhs != dst)) {
    if (srcParts != 0) {
      *dst = 0;
      if (srcParts != 1) {
        memset(dst + 1,0,(ulong)(srcParts - 1) << 3);
      }
      if (rhsParts != 0) {
        lVar2 = 0;
        do {
          tcMultiplyPart((WordType *)((long)dst + lVar2),lhs,*(WordType *)((long)pWVar1 + lVar2),0,
                         srcParts,srcParts + 1,true);
          lVar2 = lVar2 + 8;
        } while ((ulong)rhsParts << 3 != lVar2);
      }
      return;
    }
    __assert_fail("parts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x892,"static void llvm::APInt::tcSet(WordType *, WordType, unsigned int)");
  }
  __assert_fail("dst != lhs && dst != rhs",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x9c2,
                "static void llvm::APInt::tcFullMultiply(WordType *, const WordType *, const WordType *, unsigned int, unsigned int)"
               );
}

Assistant:

void APInt::tcFullMultiply(WordType *dst, const WordType *lhs,
                           const WordType *rhs, unsigned lhsParts,
                           unsigned rhsParts) {
  /* Put the narrower number on the LHS for less loops below.  */
  if (lhsParts > rhsParts)
    return tcFullMultiply (dst, rhs, lhs, rhsParts, lhsParts);

  assert(dst != lhs && dst != rhs);

  tcSet(dst, 0, rhsParts);

  for (unsigned i = 0; i < lhsParts; i++)
    tcMultiplyPart(&dst[i], rhs, lhs[i], 0, rhsParts, rhsParts + 1, true);
}